

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::MeshLoader::begin__polylist(MeshLoader *this,polylist__AttributeData *attributeData)

{
  FileId *pFVar1;
  ObjectId OVar2;
  GeometryMaterialIdInfo *this_00;
  MeshPrimitive *pMVar3;
  _func_int **pp_Var4;
  MaterialId MVar5;
  allocator<char> local_41;
  String local_40;
  
  this->mCurrentPrimitiveType = POLYLIST;
  pMVar3 = (MeshPrimitive *)operator_new(0x138);
  IFilePartLoader::createUniqueId((UniqueId *)&local_40,(IFilePartLoader *)this,PRIMITIVE_ELEMENT);
  COLLADAFW::MeshPrimitive::MeshPrimitive(pMVar3,(UniqueId *)&local_40,POLYLIST);
  pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.super_Object._vptr_Object =
       (_func_int **)0x0;
  *(undefined8 *)&pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId =
       0;
  pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId.mObjectId = 0;
  *(undefined4 *)
   &pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId.mFileId = 3;
  (pMVar3->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>).super_Object._vptr_Object =
       (_func_int **)&PTR__MeshPrimitiveWithFaceVertexCount_009dcb30;
  COLLADAFW::UniqueId::~UniqueId((UniqueId *)&local_40);
  OVar2 = attributeData->count;
  if (OVar2 == 0) {
    pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.super_Object._vptr_Object
         = (_func_int **)0x0;
    *(undefined8 *)&pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId
         = 0;
    pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId.mObjectId = 0;
  }
  else {
    pp_Var4 = (_func_int **)malloc(OVar2 * 4);
    pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.super_Object._vptr_Object
         = pp_Var4;
    *(undefined8 *)&pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId
         = 0;
    pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId.mObjectId =
         OVar2;
  }
  pFVar1 = &pMVar3[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId.mFileId;
  *(byte *)pFVar1 = (byte)*pFVar1 | 1;
  this->mCurrentMeshPrimitive = pMVar3;
  if (attributeData->material != (char *)0x0) {
    this_00 = this->mMaterialIdInfo;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,attributeData->material,&local_41);
    MVar5 = GeometryMaterialIdInfo::getMaterialId(this_00,&local_40);
    pMVar3->mMaterialId = MVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pMVar3 = this->mCurrentMeshPrimitive;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,attributeData->material,&local_41);
    std::__cxx11::string::_M_assign((string *)&pMVar3->mMaterial);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool MeshLoader::begin__polylist( const polylist__AttributeData& attributeData )
	{
		mCurrentPrimitiveType = POLYLIST;
        COLLADAFW::Polylist* polylist = new COLLADAFW::Polylist(createUniqueId(COLLADAFW::Polylist::ID()));
		polylist->getGroupedVerticesVertexCountArray().allocMemory((size_t)attributeData.count);
		mCurrentMeshPrimitive = polylist;
		if ( attributeData.material )
		{
			mCurrentMeshPrimitive->setMaterialId(mMaterialIdInfo.getMaterialId( attributeData.material ));
			mCurrentMeshPrimitive->setMaterial(attributeData.material);

		}
		return true;
	}